

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void duckdb::MinMaxNUpdate<duckdb::MinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  UnaryAggregateHeap<int,_duckdb::GreaterThan> *this;
  ArenaAllocator *this_00;
  ulong uVar1;
  HeapEntry<int> *__s;
  InvalidInputException *pIVar2;
  ulong uVar3;
  ulong uVar4;
  TYPE val_val;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat val_format;
  UnifiedVectorFormat state_format;
  string local_138;
  AggregateInputData *local_118;
  ulong local_110;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  local_118 = aggr_input;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(inputs,count,&local_c0);
  Vector::ToUnifiedFormat(inputs + 1,count,&local_108);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  if (count != 0) {
    uVar4 = 0;
    local_110 = count;
    do {
      uVar3 = uVar4;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(local_c0.sel)->sel_vector[uVar4];
      }
      if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6] >>
           (uVar3 & 0x3f) & 1) != 0)) {
        uVar1 = uVar4;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar1 = (ulong)(local_78.sel)->sel_vector[uVar4];
        }
        this = *(UnaryAggregateHeap<int,_duckdb::GreaterThan> **)(local_78.data + uVar1 * 8);
        if ((char)this[1].capacity == '\0') {
          uVar1 = uVar4;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            uVar1 = (ulong)(local_108.sel)->sel_vector[uVar4];
          }
          if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            if ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
              pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"Invalid input for MIN/MAX: n value cannot be NULL",""
                        );
              InvalidInputException::InvalidInputException(pIVar2,&local_138);
              __cxa_throw(pIVar2,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
          }
          uVar1 = *(ulong *)(local_108.data + uVar1 * 8);
          if ((long)uVar1 < 1) {
            pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"Invalid input for MIN/MAX: n value must be > 0","");
            InvalidInputException::InvalidInputException(pIVar2,&local_138);
            __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          if (999999 < uVar1) {
            pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_138,"Invalid input for MIN/MAX: n value must be < %d","");
            InvalidInputException::InvalidInputException<long>(pIVar2,&local_138,1000000);
            __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          this_00 = local_118->allocator;
          this->capacity = uVar1;
          __s = (HeapEntry<int> *)ArenaAllocator::AllocateAligned(this_00,uVar1 << 2);
          switchD_01043a80::default(__s,0,this->capacity << 2);
          this->heap = __s;
          this->size = 0;
          *(undefined1 *)&this[1].capacity = 1;
          count = local_110;
        }
        local_138._M_dataplus._M_p._0_4_ = *(undefined4 *)(local_c0.data + uVar3 * 4);
        UnaryAggregateHeap<int,_duckdb::GreaterThan>::Insert
                  (this,local_118->allocator,(int *)&local_138);
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_108.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void MinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                          idx_t count) {

	auto &val_vector = inputs[0];
	auto &n_vector = inputs[1];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto val_idx = val_format.sel->get_index(i);
		if (!val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for MIN/MAX: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for MIN/MAX: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for MIN/MAX: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);
		state.heap.Insert(aggr_input.allocator, val_val);
	}
}